

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O0

CURLUcode parse_hostname_login(Curl_URL *u,char **hostname,uint flags)

{
  char *login_00;
  char *pcVar1;
  Curl_handler **local_78;
  char *login;
  char *ptr;
  Curl_handler *h;
  char *optionsp;
  char *passwdp;
  char *userp;
  CURLUcode local_28;
  CURLcode ccode;
  CURLUcode result;
  uint flags_local;
  char **hostname_local;
  Curl_URL *u_local;
  
  local_28 = CURLUE_OK;
  passwdp = (char *)0x0;
  optionsp = (char *)0x0;
  h = (Curl_handler *)0x0;
  ptr = (char *)0x0;
  ccode = flags;
  _result = hostname;
  hostname_local = &u->scheme;
  pcVar1 = strchr(*hostname,0x40);
  login_00 = *_result;
  if (pcVar1 != (char *)0x0) {
    *_result = pcVar1 + 1;
    if (*hostname_local != (char *)0x0) {
      ptr = (char *)Curl_builtin_scheme(*hostname_local);
    }
    if ((ptr == (char *)0x0) || ((*(uint *)(ptr + 0x84) & 0x400) == 0)) {
      local_78 = (Curl_handler **)0x0;
    }
    else {
      local_78 = &h;
    }
    userp._4_4_ = Curl_parse_login_details
                            (login_00,(size_t)(pcVar1 + 1 + (-1 - (long)login_00)),&passwdp,
                             &optionsp,(char **)local_78);
    if (userp._4_4_ == CURLE_OK) {
      if (passwdp != (char *)0x0) {
        if ((ccode & CURLE_OBSOLETE32) != CURLE_OK) {
          local_28 = CURLUE_USER_NOT_ALLOWED;
          goto LAB_00175adc;
        }
        hostname_local[1] = passwdp;
      }
      if (optionsp != (char *)0x0) {
        hostname_local[2] = optionsp;
      }
      if (h != (Curl_handler *)0x0) {
        hostname_local[3] = (char *)h;
      }
      return CURLUE_OK;
    }
    local_28 = CURLUE_MALFORMED_INPUT;
  }
LAB_00175adc:
  (*Curl_cfree)(passwdp);
  (*Curl_cfree)(optionsp);
  (*Curl_cfree)(h);
  return local_28;
}

Assistant:

static CURLUcode parse_hostname_login(struct Curl_URL *u,
                                      char **hostname,
                                      unsigned int flags)
{
  CURLUcode result = CURLUE_OK;
  CURLcode ccode;
  char *userp = NULL;
  char *passwdp = NULL;
  char *optionsp = NULL;
  const struct Curl_handler *h = NULL;

  /* At this point, we're hoping all the other special cases have
   * been taken care of, so conn->host.name is at most
   *    [user[:password][;options]]@]hostname
   *
   * We need somewhere to put the embedded details, so do that first.
   */

  char *ptr = strchr(*hostname, '@');
  char *login = *hostname;

  if(!ptr)
    goto out;

  /* We will now try to extract the
   * possible login information in a string like:
   * ftp://user:password@ftp.my.site:8021/README */
  *hostname = ++ptr;

  /* if this is a known scheme, get some details */
  if(u->scheme)
    h = Curl_builtin_scheme(u->scheme);

  /* We could use the login information in the URL so extract it. Only parse
     options if the handler says we should. Note that 'h' might be NULL! */
  ccode = Curl_parse_login_details(login, ptr - login - 1,
                                   &userp, &passwdp,
                                   (h && (h->flags & PROTOPT_URLOPTIONS)) ?
                                   &optionsp:NULL);
  if(ccode) {
    result = CURLUE_MALFORMED_INPUT;
    goto out;
  }

  if(userp) {
    if(flags & CURLU_DISALLOW_USER) {
      /* Option DISALLOW_USER is set and url contains username. */
      result = CURLUE_USER_NOT_ALLOWED;
      goto out;
    }

    u->user = userp;
  }

  if(passwdp)
    u->password = passwdp;

  if(optionsp)
    u->options = optionsp;

  return CURLUE_OK;
  out:

  free(userp);
  free(passwdp);
  free(optionsp);

  return result;
}